

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O2

void __thiscall DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(DbCheckPostLower *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  Instr *pIVar4;
  uint lineNumber;
  undefined **ppuVar5;
  char *this_00;
  
  pIVar4 = instr;
  if ((instr->m_opcode == CALL) && (bVar2 = IR::Instr::HasLazyBailOut(instr), bVar2)) {
    ppuVar5 = &PTR_013e5f18;
    puVar3 = (undefined4 *)__tls_get_addr();
    this_00 = (char *)ppuVar5;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
    ;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                       ,0x156,"(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut())",
                       "instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut()");
    if (!bVar2) {
LAB_003ebf60:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
LAB_003ebdec:
  do {
    while( true ) {
      do {
        pIVar4 = pIVar4->m_next;
        bVar2 = IsEndBoundary((DbCheckPostLower *)this_00,pIVar4);
        if (bVar2) {
          EnsureValidEndBoundary((DbCheckPostLower *)this_00,pIVar4);
          return;
        }
      } while (pIVar4->m_kind == InstrKindPragma);
      bVar2 = IsAssign((DbCheckPostLower *)this_00,pIVar4);
      if (bVar2) goto code_r0x003ebe12;
      bVar2 = IsCallToHelper((DbCheckPostLower *)this_00,instr,HelperOp_Typeof);
      if (!bVar2) break;
      bVar2 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar4,HelperOp_Equal);
      if ((((!bVar2) &&
           (bVar2 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar4,HelperOp_StrictEqual), !bVar2)
           ) && (bVar2 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar4,HelperOP_CmEq_A), !bVar2)
          ) && (bVar2 = IsCallToHelper((DbCheckPostLower *)this_00,pIVar4,HelperOP_CmNeq_A), !bVar2)
         ) {
        IR::Instr::Dump(pIVar4);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        lineNumber = 0x177;
        message = "Nested helper call. Branch TypeOf/Equal doesn\'t match.";
        goto LAB_003ebf38;
      }
    }
  } while (pIVar4->m_opcode == LEA);
  IR::Instr::Dump(pIVar4);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar3 = 1;
  lineNumber = 0x181;
  message = "Nested helper call. Not assignment after CALL.";
  goto LAB_003ebf38;
code_r0x003ebe12:
  this_00 = (char *)pIVar4->m_dst;
  bVar2 = IR::Opnd::IsRegOpnd((Opnd *)this_00);
  if ((bVar2) || (pIVar4->m_noLazyHelperAssert != false)) goto LAB_003ebdec;
  IR::Instr::Dump(pIVar4);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar3 = 1;
  lineNumber = 0x166;
  message = "Nested helper call. Non-register operand for destination.";
LAB_003ebf38:
  this_00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
  ;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                     ,lineNumber,"(false)",message);
  if (!bVar2) goto LAB_003ebf60;
  *puVar3 = 0;
  goto LAB_003ebdec;
}

Assistant:

void
DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(IR::Instr *instr)
{
    IR::Instr *startingCallInstrSequence = instr;
    Assert(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut());
    instr = instr->m_next;
    while (!this->IsEndBoundary(instr))
    {
        if (!instr->IsPragmaInstr())
        {
            if (this->IsAssign(instr))
            {
                if (!instr->GetDst()->IsRegOpnd())
                {
                    // Instructions such as Op_SetElementI with LazyBailOut are
                    // followed by a MOV to re-enable implicit calls, don't throw
                    // in such cases.
                    if (!instr->m_noLazyHelperAssert)
                    {
                        instr->Dump();
                        AssertMsg(false, "Nested helper call. Non-register operand for destination.");
                    }
                }
            }
            else if (this->IsCallToHelper(startingCallInstrSequence, IR::HelperOp_Typeof))
            {
                if (this->IsCallToHelper(instr, IR::HelperOp_Equal) ||
                    this->IsCallToHelper(instr, IR::HelperOp_StrictEqual) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmEq_A) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmNeq_A)
                    )
                {
                    // Pattern matched
                }
                else
                {
                    instr->Dump();
                    AssertMsg(false, "Nested helper call. Branch TypeOf/Equal doesn't match.");
                }
            }
            else if (instr->m_opcode == Js::OpCode::LEA)
            {
                // Skip, this is probably NewScArray
            }
            else
            {
                instr->Dump();
                AssertMsg(false, "Nested helper call. Not assignment after CALL.");
            }
        }

        instr = instr->m_next;
    }

    this->EnsureValidEndBoundary(instr);
}